

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefitool.cpp
# Opt level: O0

void __thiscall UEFITool::openImageFile(UEFITool *this,QString *path)

{
  QString *pQVar1;
  bool bVar2;
  byte bVar3;
  FfsFinder *pFVar4;
  FfsOperations *pFVar5;
  FfsReport *pFVar6;
  UINT64 UVar7;
  QFile *ctx;
  QString local_1e8;
  QLatin1Char local_1cb;
  QChar local_1ca;
  QString local_1c8;
  QString local_1b0;
  QString local_198;
  QFlags<QMessageBox::StandardButton> local_17c;
  QString local_178;
  QString local_160;
  USTATUS local_148;
  USTATUS result;
  QString local_138;
  QLatin1Char local_11b;
  QChar local_11a;
  QString local_118;
  QString local_100;
  QString local_e8;
  undefined1 local_d0 [8];
  QByteArray buffer;
  QString local_b0;
  QString local_98;
  QFlags<QIODeviceBase::OpenModeFlag> local_7c;
  QFile local_78 [8];
  QFile inputFile;
  QString local_60;
  QFileInfo local_48 [8];
  QFileInfo fileInfo;
  QString local_30;
  QString *local_18;
  QString *path_local;
  UEFITool *this_local;
  
  local_18 = path;
  path_local = (QString *)this;
  QString::trimmed(&local_30,path);
  bVar2 = QString::isEmpty(&local_30);
  QString::~QString(&local_30);
  if (!bVar2) {
    QFileInfo::QFileInfo(local_48,(QString *)path);
    bVar3 = QFileInfo::exists();
    if ((bVar3 & 1) == 0) {
      pQVar1 = *(QString **)(this->ui + 0x1d8);
      tr(&local_60,"Please select existing file",(char *)0x0,-1);
      QStatusBar::showMessage(pQVar1,(int)&local_60);
      QString::~QString(&local_60);
    }
    else {
      QFile::QFile(local_78);
      QFile::setFileName((QString *)local_78);
      QFlags<QIODeviceBase::OpenModeFlag>::QFlags(&local_7c,ReadOnly);
      bVar3 = QFile::open((QFlags_conflict1 *)local_78);
      if ((bVar3 & 1) == 0) {
        tr(&local_98,"Image parsing failed",(char *)0x0,-1);
        tr(&local_b0,"Can\'t open input file for reading",(char *)0x0,-1);
        QFlags<QMessageBox::StandardButton>::QFlags
                  ((QFlags<QMessageBox::StandardButton> *)((long)&buffer.d.size + 4),FirstButton);
        QMessageBox::critical
                  ((QWidget *)this,(QString *)&local_98,(QString *)&local_b0,
                   (QFlags_conflict1 *)(ulong)buffer.d.size._4_4_,NoButton);
        QString::~QString(&local_b0);
        QString::~QString(&local_98);
      }
      else {
        ctx = local_78;
        QIODevice::readAll();
        QFileDevice::close();
        init(this,(EVP_PKEY_CTX *)ctx);
        tr(&local_118,"UEFITool %1 - %2",(char *)0x0,-1);
        QLatin1Char::QLatin1Char(&local_11b,' ');
        QChar::QChar(&local_11a,local_11b);
        QString::arg((QString *)&local_100,(int)&local_118,(QChar)((short)this + L'à'));
        QFileInfo::fileName();
        QLatin1Char::QLatin1Char((QLatin1Char *)((long)&result + 5),' ');
        QChar::QChar((QChar *)((long)&result + 6),result._5_1_);
        QString::arg((QString *)&local_e8,(int)&local_100,(QChar)(char16_t)&local_138);
        QWidget::setWindowTitle((QString *)this);
        QString::~QString(&local_e8);
        QString::~QString(&local_138);
        QString::~QString(&local_100);
        QString::~QString(&local_118);
        local_148 = FfsParser::parse(this->ffsParser,(QByteArray *)local_d0);
        showParserMessages(this);
        if (local_148 == 0) {
          pQVar1 = *(QString **)(this->ui + 0x1d8);
          tr(&local_1b0,"Opened: %1",(char *)0x0,-1);
          QFileInfo::fileName();
          QLatin1Char::QLatin1Char(&local_1cb,' ');
          QChar::QChar(&local_1ca,local_1cb);
          QString::arg((QString *)&local_198,(int)&local_1b0,(QChar)(char16_t)&local_1c8);
          QStatusBar::showMessage(pQVar1,(int)&local_198);
          QString::~QString(&local_198);
          QString::~QString(&local_1c8);
          QString::~QString(&local_1b0);
          FfsParser::outputInfo(this->ffsParser);
          showFitTable(this);
          showSecurityInfo(this);
          pFVar4 = this->ffsFinder;
          if (pFVar4 != (FfsFinder *)0x0) {
            FfsFinder::~FfsFinder(pFVar4);
            operator_delete(pFVar4,0x20);
          }
          pFVar4 = (FfsFinder *)operator_new(0x20);
          FfsFinder::FfsFinder(pFVar4,this->model);
          this->ffsFinder = pFVar4;
          QAction::setEnabled(SUB81(*(undefined8 *)(this->ui + 0x68),0));
          pFVar5 = this->ffsOps;
          if (pFVar5 != (FfsOperations *)0x0) {
            FfsOperations::~FfsOperations(pFVar5);
            operator_delete(pFVar5,0x20);
          }
          pFVar5 = (FfsOperations *)operator_new(0x20);
          FfsOperations::FfsOperations(pFVar5,this->model);
          this->ffsOps = pFVar5;
          pFVar6 = this->ffsReport;
          if (pFVar6 != (FfsReport *)0x0) {
            FfsReport::~FfsReport(pFVar6);
            operator_delete(pFVar6,8);
          }
          pFVar6 = (FfsReport *)operator_new(8);
          FfsReport::FfsReport(pFVar6,this->model);
          this->ffsReport = pFVar6;
          QAction::setEnabled(SUB81(*(undefined8 *)(this->ui + 0xb0),0));
          UVar7 = FfsParser::getAddressDiff(this->ffsParser);
          if (UVar7 < 0x100000000) {
            QAction::setEnabled(SUB81(*(undefined8 *)(this->ui + 0xd0),0));
          }
          QAction::setEnabled(SUB81(*(undefined8 *)(this->ui + 0xe0),0));
          QAction::setEnabled(SUB81(*(undefined8 *)(this->ui + 0xf8),0));
          QFileInfo::absolutePath();
          QString::operator=(&this->currentDir,&local_1e8);
          QString::~QString(&local_1e8);
          QString::operator=(&this->currentPath,(QString *)path);
        }
        else {
          tr(&local_160,"Image parsing failed",(char *)0x0,-1);
          errorCodeToUString(&local_178,local_148);
          QFlags<QMessageBox::StandardButton>::QFlags(&local_17c,FirstButton);
          QMessageBox::critical
                    ((QWidget *)this,(QString *)&local_160,(QString *)&local_178,
                     (QFlags_conflict1 *)(ulong)(uint)local_17c.i,NoButton);
          QString::~QString(&local_178);
          QString::~QString(&local_160);
        }
        QByteArray::~QByteArray((QByteArray *)local_d0);
      }
      QFile::~QFile(local_78);
    }
    QFileInfo::~QFileInfo(local_48);
  }
  return;
}

Assistant:

void UEFITool::openImageFile(QString path)
{
    if (path.trimmed().isEmpty())
        return;
    
    QFileInfo fileInfo = QFileInfo(path);
    
    if (!fileInfo.exists()) {
        ui->statusBar->showMessage(tr("Please select existing file"));
        return;
    }
    
    QFile inputFile;
    inputFile.setFileName(path);
    
    if (!inputFile.open(QFile::ReadOnly)) {
        QMessageBox::critical(this, tr("Image parsing failed"), tr("Can't open input file for reading"), QMessageBox::Ok);
        return;
    }
    
    QByteArray buffer = inputFile.readAll();
    inputFile.close();
    
    init();
    setWindowTitle(tr("UEFITool %1 - %2").arg(version).arg(fileInfo.fileName()));
    
    // Parse the image
    USTATUS result = ffsParser->parse(buffer);
    showParserMessages();
    if (result) {
        QMessageBox::critical(this, tr("Image parsing failed"), errorCodeToUString(result), QMessageBox::Ok);
        return;
    }
    else {
        ui->statusBar->showMessage(tr("Opened: %1").arg(fileInfo.fileName()));
    }
    ffsParser->outputInfo();
    
    // Enable or disable FIT tab
    showFitTable();
    
    // Enable or disable Security tab
    showSecurityInfo();
    
    // Enable search ...
    delete ffsFinder;
    ffsFinder = new FfsFinder(model);
    ui->actionSearch->setEnabled(true);
    // ... and other operations
    delete ffsOps;
    ffsOps = new FfsOperations(model);
    // ... and reports
    delete ffsReport;
    ffsReport = new FfsReport(model);
    
    // Enable goToBase and goToAddress
    ui->actionGoToBase->setEnabled(true);
    if (ffsParser->getAddressDiff() <= 0xFFFFFFFFUL)
        ui->actionGoToAddress->setEnabled(true);
    
    // Enable generateReport
    ui->actionGenerateReport->setEnabled(true);
    
    // Enable saving GUIDs
    ui->actionExportDiscoveredGuids->setEnabled(true);
    
    // Set current directory
    currentDir = fileInfo.absolutePath();
    
    // Set current path
    currentPath = path;
}